

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

int __thiscall chrono::ChSystem::FileProcessChR(ChSystem *this,ChStreamInBinary *m_file)

{
  int iVar1;
  ChException *pCVar2;
  string mchunk;
  string local_88;
  string local_68;
  string local_48;
  
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  ChStreamInBinary::operator>>(m_file,&local_88);
  iVar1 = std::__cxx11::string::compare((char *)&local_88);
  if (iVar1 != 0) {
    pCVar2 = (ChException *)__cxa_allocate_exception(0x28);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Not a ChR data file.","");
    ChException::ChException(pCVar2,&local_48);
    __cxa_throw(pCVar2,&ChException::typeinfo,ChException::~ChException);
  }
  ChStreamInBinary::operator>>(m_file,&local_88);
  iVar1 = std::__cxx11::string::compare((char *)&local_88);
  if (iVar1 == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,
                      CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                               local_88.field_2._M_local_buf[0]) + 1);
    }
    return 1;
  }
  pCVar2 = (ChException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"The end of ChR data file is badly formatted.","");
  ChException::ChException(pCVar2,&local_68);
  __cxa_throw(pCVar2,&ChException::typeinfo,ChException::~ChException);
}

Assistant:

int ChSystem::FileProcessChR(ChStreamInBinary& m_file) {
    std::string mchunk;

    m_file >> mchunk;
    if (mchunk != CH_CHUNK_START)
        throw ChException("Not a ChR data file.");

    // StreamINall(m_file);

    m_file >> mchunk;
    if (mchunk != CH_CHUNK_END)
        throw ChException("The end of ChR data file is badly formatted.");

    return 1;
}